

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int diamond_search_sad(FULLPEL_MV start_mv,uint start_mv_sad,FULLPEL_MOTION_SEARCH_PARAMS *ms_params
                      ,int search_step,int *num00,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FULLPEL_MV FVar4;
  int iVar5;
  buf_2d *pbVar6;
  buf_2d *pbVar7;
  search_site_config *psVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  short sVar12;
  short sVar13;
  bool bVar14;
  long lVar15;
  int j;
  uint uVar16;
  undefined4 uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint8_t *puVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint8_t *puVar29;
  int *piVar30;
  long lVar31;
  search_site *psVar32;
  ulong uVar33;
  bool bVar34;
  short sVar35;
  short sVar37;
  undefined1 auVar36 [16];
  FULLPEL_MV local_fc;
  undefined1 local_d8 [112];
  uint sads [4];
  uchar *block_offset [4];
  
  pbVar6 = (ms_params->ms_buffers).ref;
  pbVar7 = (ms_params->ms_buffers).src;
  psVar8 = ms_params->search_sites;
  iVar22 = psVar8->num_search_steps;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    local_fc = *second_best_mv;
  }
  puVar9 = pbVar7->buf;
  iVar2 = pbVar7->stride;
  iVar3 = pbVar6->stride;
  *best_mv = start_mv;
  uVar28 = iVar22 - search_step;
  uVar26 = (ulong)uVar28;
  puVar29 = pbVar6->buf + (((int)start_mv >> 0x10) + (int)start_mv.row * pbVar6->stride);
  if ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0) {
    if (0 < (int)uVar28) {
      bVar14 = false;
      iVar22 = 0;
      do {
        iVar5 = (int)uVar26;
        uVar26 = (ulong)(iVar5 - 1);
        uVar28 = psVar8->searches_per_step[uVar26];
        if (((((int)psVar8->site[uVar26][1].mv.row + (int)best_mv->row <
               (ms_params->mv_limits).row_min) ||
             ((ms_params->mv_limits).row_max <
              (int)psVar8->site[uVar26][2].mv.row + (int)best_mv->row)) ||
            ((int)psVar8->site[uVar26][3].mv.col + (int)best_mv->col <
             (ms_params->mv_limits).col_min)) ||
           ((ms_params->mv_limits).col_max < (int)psVar8->site[uVar26][4].mv.col + (int)best_mv->col
           )) {
          if (0 < (int)uVar28) {
            iVar24 = 0;
            uVar27 = 0;
            uVar33 = 1;
            do {
              FVar4 = psVar8->site[uVar26][uVar33].mv;
              sVar35 = FVar4.row + (*best_mv).row;
              sVar37 = FVar4.col + (*best_mv).col;
              if ((((ms_params->mv_limits).col_min <= (int)sVar37) &&
                  ((int)sVar37 <= (ms_params->mv_limits).col_max)) &&
                 (((ms_params->mv_limits).row_min <= (int)sVar35 &&
                  (((int)sVar35 <= (ms_params->mv_limits).row_max &&
                   (uVar16 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                               puVar29 + psVar8->site[uVar26][uVar33].offset,iVar3),
                   uVar16 < start_mv_sad)))))) {
                bVar1 = (ms_params->mv_cost_params).mv_cost_type;
                if (bVar1 < 4) {
                  FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                  auVar36 = psllw(ZEXT416(CONCAT22(sVar37 - FVar4.col,sVar35 - FVar4.row)),3);
                  sVar35 = auVar36._0_2_;
                  sVar37 = auVar36._2_2_;
                  switch(bVar1) {
                  case 0:
                    uVar19 = ((ms_params->mv_cost_params).mvcost[0][sVar35] +
                              *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar37 != 0) * 4 + (uint)(sVar35 != 0) * 8)) +
                             (ms_params->mv_cost_params).mvcost[1][sVar37]) *
                             (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                    break;
                  case 1:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar19 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                            (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12)) * 4;
                    break;
                  case 2:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar19 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                            (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12)) * 0xf >> 3;
                    break;
                  case 3:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar19 = (uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                           (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12);
                  }
                }
                else {
                  uVar19 = 0;
                }
                uVar19 = uVar19 + uVar16;
                bVar34 = uVar19 < start_mv_sad;
                if (bVar34) {
                  start_mv_sad = uVar19;
                }
                iVar24 = (int)uVar27;
                if (bVar34) {
                  uVar27 = uVar33 & 0xffffffff;
                  iVar24 = (int)uVar33;
                }
              }
              uVar33 = uVar33 + 1;
            } while ((ulong)uVar28 + 1 != uVar33);
            goto LAB_001e0520;
          }
LAB_001e0582:
          iVar22 = iVar22 + (uint)!bVar14;
          if ((3 < iVar5) && (psVar8->radius[iVar5 - 2] == psVar8->radius[uVar26])) {
            do {
              iVar22 = iVar22 + 1;
              uVar27 = uVar26 - 1;
              if ((long)uVar26 < 4) break;
              lVar31 = uVar26 + 0x15;
              lVar15 = uVar26 + 0x14;
              uVar26 = uVar27;
            } while (psVar8->searches_per_step[lVar15] == psVar8->searches_per_step[lVar31]);
            uVar26 = uVar27 & 0xffffffff;
          }
        }
        else {
          if ((int)uVar28 < 1) goto LAB_001e0582;
          piVar30 = &psVar8->site[uVar26][1].offset;
          psVar32 = psVar8->site[uVar26] + 1;
          iVar18 = 1;
          iVar20 = 0;
          iVar24 = 0;
          iVar25 = iVar24;
          do {
            lVar31 = 0;
            do {
              block_offset[lVar31] = puVar29 + piVar30[lVar31 * 2];
              lVar31 = lVar31 + 1;
            } while (lVar31 != 4);
            (*ms_params->sdx4df)(puVar9,iVar2,block_offset,iVar3,sads);
            lVar31 = 0;
            do {
              if (sads[lVar31] < start_mv_sad) {
                bVar1 = (ms_params->mv_cost_params).mv_cost_type;
                if (bVar1 < 4) {
                  FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                  auVar36 = psllw(ZEXT416(CONCAT22((psVar32[lVar31].mv.col + (*best_mv).col) -
                                                   FVar4.col,
                                                   (psVar32[lVar31].mv.row + (*best_mv).row) -
                                                   FVar4.row)),3);
                  sVar35 = auVar36._0_2_;
                  sVar37 = auVar36._2_2_;
                  switch(bVar1) {
                  case 0:
                    uVar16 = ((ms_params->mv_cost_params).mvcost[0][sVar35] +
                              *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar37 != 0) * 4 + (uint)(sVar35 != 0) * 8)) +
                             (ms_params->mv_cost_params).mvcost[1][sVar37]) *
                             (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                    break;
                  case 1:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar16 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                            (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12)) * 4;
                    break;
                  case 2:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar16 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                            (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12)) * 0xf >> 3;
                    break;
                  case 3:
                    sVar12 = -sVar35;
                    sVar13 = -sVar37;
                    uVar16 = (uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                           (ushort)(sVar13 >= sVar37) * sVar13) +
                             (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12);
                  }
                }
                else {
                  uVar16 = 0;
                }
                uVar16 = uVar16 + sads[lVar31];
                iVar21 = (int)lVar31 + iVar20 + 1;
                iVar24 = iVar25;
                if (uVar16 < start_mv_sad) {
                  iVar24 = iVar21;
                  iVar25 = iVar21;
                  start_mv_sad = uVar16;
                }
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != 4);
            iVar18 = iVar18 + 4;
            piVar30 = piVar30 + 8;
            iVar20 = iVar20 + 4;
            psVar32 = psVar32 + 4;
          } while (iVar18 <= (int)uVar28);
LAB_001e0520:
          if (iVar24 == 0) goto LAB_001e0582;
          local_fc = *best_mv;
          best_mv->row = psVar8->site[uVar26][iVar24].mv.row + local_fc.row;
          best_mv->col = local_fc.col + psVar8->site[uVar26][iVar24].mv.col;
          puVar29 = puVar29 + psVar8->site[uVar26][iVar24].offset;
          bVar14 = true;
        }
      } while (0 < (int)uVar26);
      goto LAB_001e05d5;
    }
  }
  else if (0 < (int)uVar28) {
    bVar14 = false;
    iVar22 = 0;
    do {
      iVar2 = (int)uVar26;
      uVar26 = (ulong)(iVar2 - 1);
      uVar28 = psVar8->searches_per_step[uVar26];
      if ((int)uVar28 < 1) {
LAB_001e006e:
        iVar22 = iVar22 + (uint)!bVar14;
        if ((3 < iVar2) && (psVar8->radius[iVar2 - 2] == psVar8->radius[uVar26])) {
          do {
            iVar22 = iVar22 + 1;
            uVar27 = uVar26 - 1;
            if ((long)uVar26 < 4) break;
            lVar31 = uVar26 + 0x15;
            lVar15 = uVar26 + 0x14;
            uVar26 = uVar27;
          } while (psVar8->searches_per_step[lVar15] == psVar8->searches_per_step[lVar31]);
          uVar26 = uVar27 & 0xffffffff;
        }
      }
      else {
        auVar36._12_4_ = 0;
        auVar36._0_12_ = local_d8._4_12_;
        local_d8._0_16_ = auVar36 << 0x20;
        lVar31 = 1;
        do {
          FVar4 = psVar8->site[uVar26][lVar31].mv;
          sVar35 = FVar4.row + (*best_mv).row;
          sVar37 = FVar4.col + (*best_mv).col;
          if (((((ms_params->mv_limits).col_min <= (int)sVar37) &&
               ((int)sVar37 <= (ms_params->mv_limits).col_max)) &&
              ((ms_params->mv_limits).row_min <= (int)sVar35)) &&
             ((int)sVar35 <= (ms_params->mv_limits).row_max)) {
            puVar23 = puVar29 + psVar8->site[uVar26][lVar31].offset;
            puVar9 = pbVar7->buf;
            iVar5 = pbVar7->stride;
            puVar10 = (ms_params->ms_buffers).second_pred;
            puVar11 = (ms_params->ms_buffers).mask;
            if (puVar11 == (uint8_t *)0x0) {
              if (puVar10 == (uint8_t *)0x0) {
                uVar16 = (*ms_params->sdf)(puVar9,iVar5,puVar23,iVar3);
              }
              else {
                uVar16 = (*ms_params->vfp->sdaf)(puVar9,iVar5,puVar23,iVar3,puVar10);
              }
            }
            else {
              uVar16 = (*ms_params->vfp->msdf)
                                 (puVar9,iVar5,puVar23,iVar3,puVar10,puVar11,
                                  (ms_params->ms_buffers).mask_stride,
                                  (ms_params->ms_buffers).inv_mask);
            }
            if (uVar16 < start_mv_sad) {
              bVar1 = (ms_params->mv_cost_params).mv_cost_type;
              if (bVar1 < 4) {
                FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                auVar36 = psllw(ZEXT416(CONCAT22(sVar37 - FVar4.col,sVar35 - FVar4.row)),3);
                sVar35 = auVar36._0_2_;
                sVar37 = auVar36._2_2_;
                switch(bVar1) {
                case 0:
                  uVar19 = ((ms_params->mv_cost_params).mvcost[0][sVar35] +
                            *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(sVar37 != 0) * 4 + (uint)(sVar35 != 0) * 8)) +
                           (ms_params->mv_cost_params).mvcost[1][sVar37]) *
                           (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                  break;
                case 1:
                  sVar12 = -sVar35;
                  sVar13 = -sVar37;
                  uVar19 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                          (ushort)(sVar13 >= sVar37) * sVar13) +
                           (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                         (ushort)(sVar12 >= sVar35) * sVar12)) * 4;
                  break;
                case 2:
                  sVar12 = -sVar35;
                  sVar13 = -sVar37;
                  uVar19 = ((uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                          (ushort)(sVar13 >= sVar37) * sVar13) +
                           (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                         (ushort)(sVar12 >= sVar35) * sVar12)) * 0xf >> 3;
                  break;
                case 3:
                  sVar12 = -sVar35;
                  sVar13 = -sVar37;
                  uVar19 = (uint)(ushort)((ushort)(sVar13 < sVar37) * sVar37 |
                                         (ushort)(sVar13 >= sVar37) * sVar13) +
                           (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                         (ushort)(sVar12 >= sVar35) * sVar12);
                }
              }
              else {
                uVar19 = 0;
              }
              uVar19 = uVar19 + uVar16;
              uVar17 = local_d8._0_4_;
              if (uVar19 < start_mv_sad) {
                uVar17 = (undefined4)lVar31;
              }
              local_d8._0_4_ = uVar17;
              if (uVar19 < start_mv_sad) {
                start_mv_sad = uVar19;
              }
            }
          }
          lVar31 = lVar31 + 1;
        } while ((ulong)uVar28 + 1 != lVar31);
        if (local_d8._0_4_ == 0) goto LAB_001e006e;
        local_fc = *best_mv;
        lVar31 = (long)(int)local_d8._0_4_;
        best_mv->row = psVar8->site[uVar26][lVar31].mv.row + local_fc.row;
        best_mv->col = local_fc.col + psVar8->site[uVar26][lVar31].mv.col;
        puVar29 = puVar29 + psVar8->site[uVar26][lVar31].offset;
        bVar14 = true;
      }
    } while (0 < (int)uVar26);
    goto LAB_001e05d5;
  }
  iVar22 = 0;
LAB_001e05d5:
  *num00 = iVar22;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    *second_best_mv = local_fc;
  }
  return (int)second_best_mv;
}

Assistant:

static int diamond_search_sad(FULLPEL_MV start_mv, unsigned int start_mv_sad,
                              const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                              const int search_step, int *num00,
                              FULLPEL_MV *best_mv, FULLPEL_MV *second_best_mv) {
#define UPDATE_SEARCH_STEP                                      \
  do {                                                          \
    if (best_site != 0) {                                       \
      tmp_second_best_mv = *best_mv;                            \
      best_mv->row += site[best_site].mv.row;                   \
      best_mv->col += site[best_site].mv.col;                   \
      best_address += site[best_site].offset;                   \
      is_off_center = 1;                                        \
    }                                                           \
                                                                \
    if (is_off_center == 0) num_center_steps++;                 \
                                                                \
    if (best_site == 0 && step > 2) {                           \
      int next_step_size = cfg->radius[step - 1];               \
      while (next_step_size == cfg->radius[step] && step > 2) { \
        num_center_steps++;                                     \
        --step;                                                 \
        next_step_size = cfg->radius[step - 1];                 \
      }                                                         \
    }                                                           \
  } while (0)

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;

  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;

  const search_site_config *cfg = ms_params->search_sites;

  int is_off_center = 0;
  // Number of times that we have stayed in the middle. This is used to skip
  // search steps in the future if diamond_search_sad is called again.
  int num_center_steps = 0;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  FULLPEL_MV tmp_second_best_mv;
  if (second_best_mv) {
    tmp_second_best_mv = *second_best_mv;
  }

  *best_mv = start_mv;

  // Check the starting position
  const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv);
  unsigned int bestsad = start_mv_sad;

  // TODO(chiyotsai@google.com): Implement 4 points search for msdf&sdaf
  if (ms_params->ms_buffers.second_pred) {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      for (int idx = 1; idx <= num_searches; idx++) {
        const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                     best_mv->col + site[idx].mv.col };

        if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
          const uint8_t *const check_here = site[idx].offset + best_address;
          unsigned int thissad =
              get_mvpred_compound_sad(ms_params, src, check_here, ref_stride);

          if (thissad < bestsad) {
            thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
            if (thissad < bestsad) {
              bestsad = thissad;
              best_site = idx;
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  } else {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      int all_in = 1;
      // Trap illegal vectors
      all_in &= best_mv->row + site[1].mv.row >= ms_params->mv_limits.row_min;
      all_in &= best_mv->row + site[2].mv.row <= ms_params->mv_limits.row_max;
      all_in &= best_mv->col + site[3].mv.col >= ms_params->mv_limits.col_min;
      all_in &= best_mv->col + site[4].mv.col <= ms_params->mv_limits.col_max;

      if (all_in) {
        for (int idx = 1; idx <= num_searches; idx += 4) {
          unsigned char const *block_offset[4];
          unsigned int sads[4];

          for (int j = 0; j < 4; j++)
            block_offset[j] = site[idx + j].offset + best_address;

          ms_params->sdx4df(src_buf, src_stride, block_offset, ref_stride,
                            sads);
          for (int j = 0; j < 4; j++) {
            if (sads[j] < bestsad) {
              const FULLPEL_MV this_mv = { best_mv->row + site[idx + j].mv.row,
                                           best_mv->col +
                                               site[idx + j].mv.col };
              unsigned int thissad =
                  sads[j] + mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx + j;
              }
            }
          }
        }
      } else {
        for (int idx = 1; idx <= num_searches; idx++) {
          const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                       best_mv->col + site[idx].mv.col };

          if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
            const uint8_t *const check_here = site[idx].offset + best_address;
            unsigned int thissad =
                get_mvpred_sad(ms_params, src, check_here, ref_stride);

            if (thissad < bestsad) {
              thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx;
              }
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  }

  *num00 = num_center_steps;
  if (second_best_mv) {
    *second_best_mv = tmp_second_best_mv;
  }

  return bestsad;

#undef UPDATE_SEARCH_STEP
}